

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::do_call
          (Dynamic_Object_Function *this,Function_Params *params,
          Type_Conversions_State *t_conversions)

{
  Type_Conversions *bv;
  bool bVar1;
  guard_error *this_00;
  Type_Conversions_State *in_RCX;
  Boxed_Value BVar2;
  
  bv = (t_conversions->m_conversions)._M_data;
  if (bv != (Type_Conversions *)(t_conversions->m_saves)._M_data) {
    bVar1 = dynamic_object_typename_match
                      ((Dynamic_Object_Function *)params,(Boxed_Value *)bv,
                       (string *)&params[2].m_end,
                       (unique_ptr<chaiscript::Type_Info,_std::default_delete<chaiscript::Type_Info>_>
                        *)&params[5].m_end,in_RCX);
    if (bVar1) {
      BVar2 = Proxy_Function_Base::operator()
                        (&this->super_Proxy_Function_Base,(Function_Params *)params[4].m_end,
                         t_conversions);
      BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      return (Boxed_Value)
             BVar2.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  this_00 = (guard_error *)__cxa_allocate_exception(0x10);
  exception::guard_error::guard_error(this_00);
  __cxa_throw(this_00,&exception::guard_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Boxed_Value do_call(const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) const override {
          if (dynamic_object_typename_match(params, m_type_name, m_ti, t_conversions)) {
            return (*m_func)(params, t_conversions);
          } else {
            throw exception::guard_error();
          }
        }